

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomrand48.cpp
# Opt level: O2

void __thiscall jrtplib::RTPRandomRand48::SetSeed(RTPRandomRand48 *this,uint32_t seed)

{
  this->state = (ulong)seed << 0x10 | 0x330e;
  return;
}

Assistant:

void RTPRandomRand48::SetSeed(uint32_t seed)
{
#ifdef RTP_SUPPORT_THREAD
	mutex.Init(); // TODO: check error!
#endif // RTP_SUPPORT_THREAD

#ifdef RTP_HAVE_VSUINT64SUFFIX
	state = ((uint64_t)seed) << 16 | 0x330Eui64;
#else
	state = ((uint64_t)seed) << 16 | 0x330EULL;
#endif // RTP_HAVE_VSUINT64SUFFIX
}